

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O3

int_t mc64rd_(int_t *n,int_t *ne,int_t *ip,int_t *irn,double *a)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int_t iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  double dVar18;
  undefined8 local_108;
  undefined8 local_100;
  int local_f8 [50];
  
  uVar2 = *n;
  if (0 < (int)uVar2) {
    lVar11 = 1;
    do {
      iVar3 = ip[lVar11 + -1];
      iVar4 = ip[lVar11];
      if (1 < iVar4 - iVar3) {
        if (0xe < (uint)(iVar4 - iVar3)) {
          local_f8[0] = iVar3;
          local_f8[1] = iVar4;
          iVar10 = 2;
          do {
            lVar12 = (long)iVar10;
            lVar9 = lVar12 + -2;
            iVar6 = *(int *)((long)&local_100 + lVar12 * 4);
            iVar7 = *(int *)((long)&local_100 + lVar12 * 4 + 4);
            if (iVar6 < iVar7) {
              local_108 = (int *)((long)&local_100 + lVar12 * 4);
              lVar16 = (long)iVar6;
              local_100 = (int *)((long)&local_100 + lVar12 * 4 + 4);
              dVar18 = a[(long)((iVar7 + iVar6) / 2) + -1];
              lVar17 = 0;
LAB_0011436b:
              dVar1 = a[lVar16 + lVar17 + -1];
              if ((dVar1 == dVar18) && (!NAN(dVar1) && !NAN(dVar18))) goto code_r0x00114379;
              iVar15 = iVar6;
              if (dVar1 <= dVar18) {
                dVar18 = dVar1;
              }
              do {
                if (dVar18 < a[lVar16 + -1]) {
                  dVar1 = a[(long)iVar15 + -1];
                  a[(long)iVar15 + -1] = a[lVar16 + -1];
                  a[lVar16 + -1] = dVar1;
                  iVar5 = irn[(long)iVar15 + -1];
                  irn[(long)iVar15 + -1] = irn[lVar16 + -1];
                  irn[lVar16 + -1] = iVar5;
                  iVar15 = iVar15 + 1;
                }
                lVar16 = lVar16 + 1;
              } while (iVar7 != lVar16);
              iVar8 = iVar15;
              if (iVar7 - iVar15 <= iVar15 - iVar6) {
                local_108 = local_100;
                iVar8 = iVar7;
                iVar6 = iVar15;
              }
              local_f8[lVar12 + 1] = iVar8;
              local_f8[lVar12] = iVar6;
              *local_108 = iVar15;
              lVar9 = (long)(iVar10 + 2);
            }
LAB_001143ff:
            lVar12 = 2;
            do {
              if (lVar12 + lVar9 == 2) goto LAB_00114241;
              lVar16 = lVar12 * 4;
              lVar17 = lVar12 * 4;
              lVar12 = lVar12 + -2;
            } while (*(int *)((long)&local_108 + lVar16 + lVar9 * 4 + 4) -
                     *(int *)((long)&local_108 + lVar17 + lVar9 * 4) < 0xf);
            iVar10 = (int)lVar9 + (int)lVar12;
          } while( true );
        }
LAB_00114241:
        lVar12 = (long)iVar3;
        lVar9 = lVar12 + 1;
        if ((int)lVar9 < iVar4) {
          iVar10 = iVar3;
          do {
            lVar16 = (long)iVar10;
            dVar18 = a[lVar9 + -1];
            if (a[lVar16 + -1] < dVar18) {
              iVar5 = irn[lVar9 + -1];
              a[lVar9 + -1] = a[lVar16 + -1];
              irn[lVar9 + -1] = irn[lVar16 + -1];
              lVar17 = lVar12;
              pdVar14 = a + lVar12 + -1;
              if (iVar3 < iVar10) {
                lVar13 = lVar16 << 0x20;
                do {
                  if (dVar18 <= a[lVar16 + -2]) {
                    lVar17 = lVar13 >> 0x20;
                    pdVar14 = (double *)((long)a + (lVar13 >> 0x1d) + -8);
                    break;
                  }
                  a[lVar16 + -1] = a[lVar16 + -2];
                  irn[lVar16 + -1] = irn[lVar16 + -2];
                  lVar16 = lVar16 + -1;
                  lVar13 = lVar13 + -0x100000000;
                } while (lVar12 < lVar16);
              }
              *pdVar14 = dVar18;
              irn[lVar17 + -1] = iVar5;
            }
            lVar9 = lVar9 + 1;
            iVar10 = iVar10 + 1;
          } while (iVar4 != (int)lVar9);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != (ulong)uVar2 + 1);
  }
  return 0;
code_r0x00114379:
  lVar17 = lVar17 + 1;
  if (iVar7 - iVar6 == (int)lVar17) goto LAB_001143ff;
  goto LAB_0011436b;
}

Assistant:

int_t mc64rd_(int_t *n, int_t *ne, int_t *ip, int_t *
	irn, double *a)
{
    /* System generated locals */
    int_t i__1, i__2, i__3;

    /* Local variables */
    int_t j, k, r__, s;
    double ha;
    int_t hi, td, mid, len, ipj;
    double key;
    int_t last, todo[50], first;


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* This subroutine sorts the entries in each column of the */
/* sparse matrix (defined by N,NE,IP,IRN,A) by decreasing */
/* numerical value. */
/* Local constants */
/* Local variables */
/* Local arrays */
    /* Parameter adjustments */
    --ip;
    --a;
    --irn;

    /* Function Body */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	len = ip[j + 1] - ip[j];
	if (len <= 1) {
	    goto L100;
	}
	ipj = ip[j];
/* Sort array roughly with partial quicksort */
	if (len < 15) {
	    goto L400;
	}
	todo[0] = ipj;
	todo[1] = ipj + len;
	td = 2;
L500:
	first = todo[td - 2];
	last = todo[td - 1];
/* KEY is the smallest of two values present in interval [FIRST,LAST) */
	key = a[(first + last) / 2];
	i__2 = last - 1;
	for (k = first; k <= i__2; ++k) {
	    ha = a[k];
	    if (ha == key) {
		goto L475;
	    }
	    if (ha > key) {
		goto L470;
	    }
	    key = ha;
	    goto L470;
L475:
	    ;
	}
/* Only one value found in interval, so it is already sorted */
	td += -2;
	goto L425;
/* Reorder interval [FIRST,LAST) such that entries before MID are gt KEY */
L470:
	mid = first;
	i__2 = last - 1;
	for (k = first; k <= i__2; ++k) {
	    if (a[k] <= key) {
		goto L450;
	    }
	    ha = a[mid];
	    a[mid] = a[k];
	    a[k] = ha;
	    hi = irn[mid];
	    irn[mid] = irn[k];
	    irn[k] = hi;
	    ++mid;
L450:
	    ;
	}
/* Both subintervals [FIRST,MID), [MID,LAST) are nonempty */
/* Stack the longest of the two subintervals first */
	if (mid - first >= last - mid) {
	    todo[td + 1] = last;
	    todo[td] = mid;
	    todo[td - 1] = mid;
/*          TODO(TD-1) = FIRST */
	} else {
	    todo[td + 1] = mid;
	    todo[td] = first;
	    todo[td - 1] = last;
	    todo[td - 2] = mid;
	}
	td += 2;
L425:
	if (td == 0) {
	    goto L400;
	}
/* There is still work to be done */
	if (todo[td - 1] - todo[td - 2] >= 15) {
	    goto L500;
	}
/* Next interval is already short enough for straightforward insertion */
	td += -2;
	goto L425;
/* Complete sorting with straightforward insertion */
L400:
	i__2 = ipj + len - 1;
	for (r__ = ipj + 1; r__ <= i__2; ++r__) {
	    if (a[r__ - 1] < a[r__]) {
		ha = a[r__];
		hi = irn[r__];
		a[r__] = a[r__ - 1];
		irn[r__] = irn[r__ - 1];
		i__3 = ipj + 1;
		for (s = r__ - 1; s >= i__3; --s) {
		    if (a[s - 1] < ha) {
			a[s] = a[s - 1];
			irn[s] = irn[s - 1];
		    } else {
			a[s] = ha;
			irn[s] = hi;
			goto L200;
		    }
/* L300: */
		}
		a[ipj] = ha;
		irn[ipj] = hi;
	    }
L200:
	    ;
	}
L100:
	;
    }
    return 0;
}